

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

_Bool ggml_thread_apply_priority(int32_t prio)

{
  ulong uVar1;
  FILE *__stream;
  uint __errnum;
  pthread_t __target_thread;
  char *pcVar2;
  int __policy;
  sched_param p;
  
  uVar1 = (ulong)(uint)prio;
  if ((uint)prio < 4) {
    __errnum = (&switchD_00110a73::switchdataD_0015b3ec)[uVar1] + 0x15b3ec;
    switch(uVar1) {
    case 0:
      goto switchD_00110a73_caseD_0;
    case 1:
      p.sched_priority = 0x28;
      break;
    case 2:
      p.sched_priority = 0x50;
      break;
    case 3:
      p.sched_priority = 0x5a;
    }
    __policy = 1;
  }
  else {
    __policy = 0;
  }
  __target_thread = pthread_self();
  __errnum = pthread_setschedparam(__target_thread,__policy,(sched_param *)&p);
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar2 = strerror(__errnum);
    __errnum = fprintf(__stream,"warn: failed to set thread priority %d : %s (%d)\n",uVar1,pcVar2,
                       (ulong)__errnum);
  }
switchD_00110a73_caseD_0:
  return SUB41(__errnum,0);
}

Assistant:

static bool ggml_thread_apply_priority(int32_t prio) {
    struct sched_param p;
    int32_t policy = SCHED_OTHER;
    switch (prio) {
        case GGML_SCHED_PRIO_NORMAL:   policy = SCHED_OTHER; p.sched_priority = 0;  break;
        case GGML_SCHED_PRIO_MEDIUM:   policy = SCHED_FIFO;  p.sched_priority = 40; break;
        case GGML_SCHED_PRIO_HIGH:     policy = SCHED_FIFO;  p.sched_priority = 80; break;
        case GGML_SCHED_PRIO_REALTIME: policy = SCHED_FIFO;  p.sched_priority = 90; break;
    }

    if (prio == GGML_SCHED_PRIO_NORMAL) {
        // Keep inherited policy/priority
        return true;
    }

    int32_t err = pthread_setschedparam(pthread_self(), policy, &p);
    if (err != 0) {
        fprintf(stderr, "warn: failed to set thread priority %d : %s (%d)\n", prio, strerror(err), err);
        return false;
    }

    return true;
}